

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

bool __thiscall
QGraphicsAnchorLayoutPrivate::simplifyGraphIteration
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation,bool *feasible)

{
  QGraphicsLayoutItem *pQVar1;
  AnchorVertex *second;
  uint uVar2;
  bool bVar3;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_00;
  AnchorVertex *pAVar4;
  AnchorData *pAVar5;
  SequentialAnchorData *this_01;
  SequentialAnchorData *pSVar6;
  bool bVar7;
  undefined1 uVar8;
  int i;
  ulong uVar9;
  long in_FS_OFFSET;
  value_type vVar10;
  AnchorVertex *local_f0;
  AnchorVertex *local_e0;
  AnchorVertex *next;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> local_b8;
  AnchorVertex *v;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> local_98;
  QArrayDataPointer<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  local_78;
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> local_60;
  bool newFeasible;
  undefined7 uStack_57;
  Data *pDStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  this_00 = (this->graph).m_data + (long)(int)orientation + -1;
  local_60.d = (Data *)0x0;
  local_78.size = 0;
  _newFeasible = (AnchorVertex *)0x0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                  *)0x0;
  pDStack_50 = (this->graph).m_data[(long)(int)orientation + 1].m_graph.d;
  QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>::
  emplaceBack<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>const&>
            ((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
              *)&local_78,
             (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> *
             )&newFeasible);
  local_98.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (AnchorVertex **)0x0;
LAB_0055c788:
  do {
    if (local_78.size == 0) {
      uVar8 = 0;
LAB_0055cae8:
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
      ::~QArrayDataPointer(&local_78);
      QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>::~QHash(&local_60);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (bool)uVar8;
    }
    vVar10 = QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
             ::takeLast((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                         *)&local_78);
    v = vVar10.second;
    local_f0 = vVar10.first;
    Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
    adjacentVertices((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_b8,this_00,v);
    local_e0 = v;
    if ((v->m_item == pQVar1) || (local_b8.size != 2)) {
      bVar7 = true;
    }
    else {
      pAVar4 = local_f0;
      if (local_98.size != 0) {
        pAVar4 = local_98.ptr[local_98.size + -1];
      }
      _newFeasible = local_b8.ptr[pAVar4 != local_b8.ptr[1]];
      pAVar5 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
               edgeData(this_00,v,_newFeasible);
      bVar3 = QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>::contains
                        (&local_60,(AnchorVertex **)&newFeasible);
      if (bVar3) {
        pAVar4 = _newFeasible;
        if (local_f0 == _newFeasible) {
          bVar7 = true;
        }
        else {
LAB_0055c863:
          QList<QtGraphicsAnchorLayout::AnchorVertex_*>::append
                    ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_98,v);
          bVar7 = bVar3;
          local_e0 = pAVar4;
        }
      }
      else {
        bVar7 = true;
        pAVar4 = local_e0;
        if ((pAVar5->field_0x78 & 8) == 0) goto LAB_0055c863;
      }
    }
    for (uVar9 = 0; uVar9 < (ulong)local_b8.size; uVar9 = uVar9 + 1) {
      next = local_b8.ptr[uVar9];
      bVar3 = QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>::contains
                        (&local_60,&next);
      if (!bVar3) {
        _newFeasible = local_f0;
        if (bVar7 != false) {
          _newFeasible = v;
        }
        pDStack_50 = (Data *)next;
        QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
        ::
        emplaceBack<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>const&>
                  ((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
                    *)&local_78,
                   (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                    *)&newFeasible);
      }
    }
    QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::insert
              ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)&newFeasible,
               (AnchorVertex **)&local_60);
    if ((bVar7 == false) || (local_98.size == 0)) {
LAB_0055ca19:
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_b8);
      goto LAB_0055c788;
    }
    pAVar5 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             edgeData(this_00,local_f0,*local_98.ptr);
    if ((pAVar5->field_0x78 & 8) != 0) {
      local_f0 = *local_98.ptr;
      QList<QtGraphicsAnchorLayout::AnchorVertex_*>::remove
                ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_98,(char *)0x0);
      if (local_98.size == 0) goto LAB_0055ca19;
    }
    pAVar5 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             edgeData(this_00,local_98.ptr[local_98.size + -1],local_e0);
    if ((pAVar5->field_0x78 & 8) != 0) {
      local_e0 = local_98.ptr[local_98.size + -1];
      QList<QtGraphicsAnchorLayout::AnchorVertex_*>::remove
                ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_98,
                 (char *)(local_98.size + -1));
      if (local_98.size == 0) goto LAB_0055ca19;
    }
    _newFeasible = (AnchorVertex *)0x0;
    pDStack_50 = (Data *)0x0;
    local_48 = 0;
    QList<QtGraphicsAnchorLayout::AnchorData_*>::reserve
              ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)&newFeasible,local_98.size + 1);
    uVar2 = (uint)local_98.size;
    QList<QtGraphicsAnchorLayout::AnchorData_*>::reserve
              ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)&newFeasible,
               (long)(int)((uint)local_98.size + 1));
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    pAVar4 = local_f0;
    for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
      second = local_98.ptr[uVar9];
      pAVar5 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
               takeEdge(this_00,pAVar4,second);
      QList<QtGraphicsAnchorLayout::AnchorData_*>::append
                ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)&newFeasible,pAVar5);
      pAVar4 = second;
    }
    pAVar5 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             takeEdge(this_00,local_98.ptr[local_98.size + -1],local_e0);
    QList<QtGraphicsAnchorLayout::AnchorData_*>::append
              ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)&newFeasible,pAVar5);
    this_01 = (SequentialAnchorData *)operator_new(0x98);
    QtGraphicsAnchorLayout::SequentialAnchorData::SequentialAnchorData
              (this_01,(QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_98,
               (QList<QtGraphicsAnchorLayout::AnchorData_*> *)&newFeasible);
    (this_01->super_AnchorData).from = local_f0;
    (this_01->super_AnchorData).to = local_e0;
    QtGraphicsAnchorLayout::SequentialAnchorData::calculateSizeHints(this_01);
    QArrayDataPointer<QtGraphicsAnchorLayout::AnchorData_*>::~QArrayDataPointer
              ((QArrayDataPointer<QtGraphicsAnchorLayout::AnchorData_*> *)&newFeasible);
    _newFeasible = (AnchorVertex *)CONCAT71(uStack_57,0xaa);
    pSVar6 = (SequentialAnchorData *)addAnchorMaybeParallel(this,(AnchorData *)this_01,&newFeasible)
    ;
    uVar8 = newFeasible;
    if (newFeasible == false) {
      *feasible = false;
LAB_0055cade:
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_b8);
      goto LAB_0055cae8;
    }
    if (pSVar6 != this_01) goto LAB_0055cade;
    QList<QtGraphicsAnchorLayout::AnchorVertex_*>::clear
              ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_98);
    QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_b8);
  } while( true );
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::simplifyGraphIteration(Qt::Orientation orientation,
                                                          bool *feasible)
{
    Q_Q(QGraphicsAnchorLayout);
    Graph<AnchorVertex, AnchorData> &g = graph[orientation];

    QSet<AnchorVertex *> visited;
    QStack<std::pair<AnchorVertex *, AnchorVertex *> > stack;
    stack.push(std::pair(static_cast<AnchorVertex *>(nullptr), layoutFirstVertex[orientation]));
    QList<AnchorVertex *> candidates;

    // Walk depth-first, in the stack we store start of the candidate sequence (beforeSequence)
    // and the vertex to be visited.
    while (!stack.isEmpty()) {
        std::pair<AnchorVertex *, AnchorVertex *> pair = stack.pop();
        AnchorVertex *beforeSequence = pair.first;
        AnchorVertex *v = pair.second;

        // The basic idea is to determine whether we found an end of sequence,
        // if that's the case, we stop adding vertices to the candidate list
        // and do a simplification step.
        //
        // A vertex can trigger an end of sequence if
        // (a) it is a layout vertex, we don't simplify away the layout vertices;
        // (b) it does not have exactly 2 adjacents;
        // (c) its next adjacent is already visited (a cycle in the graph).
        // (d) the next anchor is a center anchor.

        const QList<AnchorVertex *> &adjacents = g.adjacentVertices(v);
        const bool isLayoutVertex = v->m_item == q;
        AnchorVertex *afterSequence = v;
        bool endOfSequence = false;

        //
        // Identify the end cases.
        //

        // Identifies cases (a) and (b)
        endOfSequence = isLayoutVertex || adjacents.size() != 2;

        if (!endOfSequence) {
            // This is a tricky part. We peek at the next vertex to find out whether
            //
            // - we already visited the next vertex (c);
            // - the next anchor is a center (d).
            //
            // Those are needed to identify the remaining end of sequence cases. Note that unlike
            // (a) and (b), we preempt the end of sequence by looking into the next vertex.

            // Peek at the next vertex
            AnchorVertex *after;
            if (candidates.isEmpty())
                after = (beforeSequence == adjacents.last() ? adjacents.first() : adjacents.last());
            else
                after = (candidates.constLast() == adjacents.last() ? adjacents.first() : adjacents.last());

            // ### At this point we assumed that candidates will not contain 'after', this may not hold
            // when simplifying FLOATing anchors.
            Q_ASSERT(!candidates.contains(after));

            const AnchorData *data = g.edgeData(v, after);
            Q_ASSERT(data);
            const bool cycleFound = visited.contains(after);

            // Now cases (c) and (d)...
            endOfSequence = cycleFound || data->isCenterAnchor;

            if (!endOfSequence) {
                // If it's not an end of sequence, then the vertex didn't trigger neither of the
                // previously three cases, so it can be added to the candidates list.
                candidates.append(v);
            } else if (cycleFound && (beforeSequence != after)) {
                afterSequence = after;
                candidates.append(v);
            }
        }

        //
        // Add next non-visited vertices to the stack.
        //
        for (int i = 0; i < adjacents.size(); ++i) {
            AnchorVertex *next = adjacents.at(i);
            if (visited.contains(next))
                continue;

            // If current vertex is an end of sequence, and it'll reset the candidates list. So
            // the next vertices will build candidates lists with the current vertex as 'before'
            // vertex. If it's not an end of sequence, we keep the original 'before' vertex,
            // since we are keeping the candidates list.
            if (endOfSequence)
                stack.push(std::pair(v, next));
            else
                stack.push(std::pair(beforeSequence, next));
        }

        visited.insert(v);

        if (!endOfSequence || candidates.isEmpty())
            continue;

        //
        // Create a sequence for (beforeSequence, candidates, afterSequence).
        //

        // One restriction we have is to not simplify half of an anchor and let the other half
        // unsimplified. So we remove center edges before and after the sequence.
        const AnchorData *firstAnchor = g.edgeData(beforeSequence, candidates.constFirst());
        if (firstAnchor->isCenterAnchor) {
            beforeSequence = candidates.constFirst();
            candidates.remove(0);

            // If there's not candidates to be simplified, leave.
            if (candidates.isEmpty())
                continue;
        }

        const AnchorData *lastAnchor = g.edgeData(candidates.constLast(), afterSequence);
        if (lastAnchor->isCenterAnchor) {
            afterSequence = candidates.constLast();
            candidates.remove(candidates.size() - 1);

            if (candidates.isEmpty())
                continue;
        }

        //
        // Add the sequence to the graph.
        //

        AnchorData *sequence = createSequence(&g, beforeSequence, candidates, afterSequence);

        // If 'beforeSequence' and 'afterSequence' already had an anchor between them, we'll
        // create a parallel anchor between the new sequence and the old anchor.
        bool newFeasible;
        AnchorData *newAnchor = addAnchorMaybeParallel(sequence, &newFeasible);

        if (!newFeasible) {
            *feasible = false;
            return false;
        }

        // When a new parallel anchor is create in the graph, we finish the iteration and return
        // true to indicate a new iteration is needed. This happens because a parallel anchor
        // changes the number of adjacents one vertex has, possibly opening up oportunities for
        // building candidate lists (when adjacents == 2).
        if (newAnchor != sequence)
            return true;

        // If there was no parallel simplification, we'll keep walking the graph. So we clear the
        // candidates list to start again.
        candidates.clear();
    }

    return false;
}